

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Command_Book.cpp
# Opt level: O2

void __thiscall bookClass::buy(bookClass *this,string *ISBN,int num)

{
  int num_00;
  vector<int,_std::allocator<int>_> index;
  string local_248;
  fstream file;
  char local_218 [512];
  
  std::__cxx11::string::string((string *)&local_248,(string *)ISBN);
  unrolledLinkedListClass::readIndexData(&index,&Isbn,&local_248,'1');
  std::__cxx11::string::~string((string *)&local_248);
  if ((long)index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == 4) {
    read_file(this,*index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
    num_00 = this->num - num;
    if (num <= this->num) {
      this->num = num_00;
      dataClass::changeBookData
                ((dataClass *)&data_manager,num_00,
                 *index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start);
      income = income + this->price * (double)num;
      printf("%.2lf\n");
      std::fstream::fstream(&file);
      std::fstream::open((char *)&file,0x10c0b5);
      std::ostream::seekp(local_218,0x10,0);
      std::ostream::write(local_218,0x112390);
      std::fstream::close();
      dataClass::recordFinance((dataClass *)&data_manager,false,(double)num * this->price);
      std::fstream::~fstream(&file);
      goto LAB_00106244;
    }
  }
  success = '0';
  puts("Invalid");
LAB_00106244:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&index.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void bookClass::buy(string ISBN, int num) {
	vector<int> index = Isbn.readIndexData(ISBN, '1');
	if (index.size() != 1) {ERROR; return ;}
	this->read_file(index[0]);
	if (this->num >= num) {
		this->num -= num;
		data_manager.changeBookData(this->num, index[0]);
		income += num * price;
		printf("%.2lf\n", num * price);
		fstream file;
		file.open("Data_Basic.dat", ios::in | ios::out | ios::binary);
		file.seekp(16);
		file.write(reinterpret_cast<char *> (&income), 8);
		file.close();
		data_manager.recordFinance(0, num * price);
	} else ERROR;
}